

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

bool __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::revalidate_data(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                  *this,size_type data_size)

{
  ushort *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  buffer_t<char> local_38;
  
  buffer_t<char>::validate(&(this->buffer_).v2_);
  local_38.begin = (this->buffer_).v2_.begin;
  uVar3 = (long)(this->buffer_).v2_.end - (long)local_38.begin;
  uVar4 = data_size;
  if (uVar3 < data_size) {
    uVar4 = uVar3;
  }
  if (data_size == 0xffffffffffffffff) {
    uVar4 = uVar3;
  }
  if ((ushort *)local_38.begin == (ushort *)0x0) {
    local_38.begin = (pointer_type)0x0;
    local_38.last = (pointer_type)0x0;
    local_38.end = (pointer_type)0x0;
    buffer_t<char>::validate(&local_38);
LAB_0010de6d:
    bVar2 = true;
  }
  else {
    local_38.end = (pointer_type)((long)local_38.begin + uVar4);
    if (uVar4 == 0) {
      local_38.last = (pointer_type)0x0;
      buffer_t<char>::validate(&local_38);
      goto LAB_0010de6d;
    }
    if ((long)uVar4 < 0) {
      std::terminate();
    }
    bVar2 = true;
    if (uVar4 == 1) {
      local_38.last = (pointer_type)0x0;
    }
    else {
      uVar3 = (ulong)*(ushort *)local_38.begin;
      puVar1 = (ushort *)local_38.begin;
      if (uVar4 < uVar3 + 2) {
        local_38.last = (pointer_type)0x0;
      }
      else {
        do {
          local_38.last = (pointer_type)puVar1;
          uVar5 = (ulong)((int)uVar3 + 3U & 0x1fffe);
          uVar4 = uVar4 - uVar5;
          if ((long)uVar4 < 2) goto LAB_0010debe;
          uVar3 = (ulong)*(ushort *)((long)local_38.last + uVar5);
          puVar1 = (ushort *)((long)local_38.last + uVar5);
        } while (uVar3 + 2 <= uVar4);
      }
      bVar2 = false;
    }
LAB_0010debe:
    buffer_t<char>::validate(&local_38);
    if (!bVar2) {
      bVar2 = false;
      local_38.begin = (pointer_type)0x0;
      goto LAB_0010df0a;
    }
  }
  flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
          *)&local_38);
LAB_0010df0a:
  (this->buffer_).v2_.last = local_38.begin;
  return bVar2;
}

Assistant:

[[nodiscard]] bool revalidate_data(size_type data_size = npos) noexcept {
        size_type new_data_size{ total_capacity() };
        if (data_size != npos) {
            new_data_size = std::min(data_size, new_data_size);
        }
        auto[valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, 
                                                                     buff().begin + new_data_size);
        buff().last = valid ? buffer_view.last().get_ptr() : nullptr;

        return valid;
    }